

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

prepare_function_for_t<short> *
prepare_for<short>(prepare_function_for_t<short> *__return_storage_ptr__,string *prepare_type)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>
  __l;
  bool bVar1;
  int iVar2;
  pointer pvVar3;
  error *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  *local_280;
  string local_250;
  undefined1 local_230 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_message;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
  local_208;
  const_iterator prepare_function;
  single_fn local_1f8;
  pipe_organ_fn local_1e1;
  outlier_fn local_1e0;
  sort_fn<std::greater<void>_> local_1ce;
  sort_fn<std::less<void>_> local_1cd [13];
  shuffle_fn local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  *local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
  local_68;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  string *prepare_type_local;
  
  local_18 = (undefined1  [8])prepare_type;
  prepare_type_local = (string *)__return_storage_ptr__;
  if (prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&prepare_for<short>(std::__cxx11::string_const&)::
                                 prepare_functions_abi_cxx11_);
    if (iVar2 != 0) {
      prepare_function.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
      ._M_cur._7_1_ = 1;
      local_1b0 = &local_1a8;
      std::make_shared<std::random_device>();
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[8],_shuffle_fn,_true>(&local_1a8,(char (*) [8])"shuffle",&local_1c0);
      local_1b0 = &local_168;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[10],_sort_fn<std::less<void>_>,_true>
                (local_1b0,(char (*) [10])"ascending",local_1cd);
      local_1b0 = &local_128;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[11],_sort_fn<std::greater<void>_>,_true>
                (local_1b0,(char (*) [11])"descending",&local_1ce);
      local_1b0 = &local_e8;
      std::make_shared<std::random_device>();
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[8],_outlier_fn,_true>(&local_e8,(char (*) [8])"outlier",&local_1e0);
      local_1b0 = &local_a8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[11],_pipe_organ_fn,_true>
                (local_1b0,(char (*) [11])(anon_var_dwarf_c93bd + 0xa9),&local_1e1);
      local_1b0 = &local_68;
      std::make_shared<std::random_device>();
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
      ::pair<const_char_(&)[7],_single_fn,_true>(&local_68,(char (*) [7])"single",&local_1f8);
      prepare_function.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
      ._M_cur._7_1_ = 0;
      local_28 = &local_1a8;
      local_20 = 6;
      this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>
              *)((long)&prepare_function.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
                        ._M_cur + 4);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>
      ::allocator(this);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>_>
      ::unordered_map(&prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_
                      ,__l,0,(hasher *)
                             ((long)&prepare_function.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
                                     ._M_cur + 6),
                      (key_equal *)
                      ((long)&prepare_function.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
                              ._M_cur + 5),this);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>
      ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>
                    *)((long)&prepare_function.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
                              ._M_cur + 4));
      local_280 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
                   *)&local_28;
      do {
        local_280 = local_280 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>
        ::~pair(local_280);
      } while (local_280 != &local_1a8);
      single_fn::~single_fn(&local_1f8);
      outlier_fn::~outlier_fn(&local_1e0);
      shuffle_fn::~shuffle_fn(&local_1c0);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>_>
                   ::~unordered_map,
                   &prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&prepare_for<short>(std::__cxx11::string_const&)::
                           prepare_functions_abi_cxx11_);
    }
  }
  local_208._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>_>
       ::find(&prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_,
              (key_type *)local_18);
  error_message.field_2._8_8_ =
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>_>_>
       ::end(&prepare_for<short>(std::__cxx11::string_const&)::prepare_functions_abi_cxx11_);
  bVar1 = std::__detail::operator!=
                    (&local_208,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_true>
                      *)((long)&error_message.field_2 + 8));
  if (!bVar1) {
    burst::literals::operator____u8s_abi_cxx11_(&local_250,anon_var_dwarf_ca9f2,0x3d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                   &local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18);
    std::__cxx11::string::~string((string *)&local_250);
    this_00 = (error *)__cxa_allocate_exception(0x10);
    boost::program_options::error::error(this_00,(string *)local_230);
    __cxa_throw(this_00,&boost::program_options::error::typeinfo,
                boost::program_options::error::~error);
  }
  pvVar3 = std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_false,_true>
           ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>_>,_false,_true>
                         *)&local_208);
  std::
  function<std::vector<short,_std::allocator<short>_>_(std::vector<short,_std::allocator<short>_>)>
  ::function(__return_storage_ptr__,&pvVar3->second);
  return __return_storage_ptr__;
}

Assistant:

prepare_function_for_t<Value> prepare_for (const std::string & prepare_type)
{
    static const auto prepare_functions =
        std::unordered_map<std::string, prepare_function_for_t<Value>>
        {
            {"shuffle", shuffle_fn{}},
            {"ascending", sort_fn<std::less<>>{}},
            {"descending", sort_fn<std::greater<>>{}},
            {"outlier", outlier_fn{}},
            {"pipe-organ", pipe_organ_fn{}},
            {"single", single_fn{}}
        };

    auto prepare_function = prepare_functions.find(prepare_type);
    if (prepare_function != prepare_functions.end())
    {
        return prepare_function->second;
    }
    else
    {
        const auto error_message = u8"Неверный тип подготовки массива: "_u8s + prepare_type;
        throw boost::program_options::error(error_message);
    }
}